

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsequentialanimationgroup.cpp
# Opt level: O0

void __thiscall
QSequentialAnimationGroupPrivate::activateCurrentAnimation
          (QSequentialAnimationGroupPrivate *this,bool intermediate)

{
  byte bVar1;
  parameter_type pVar2;
  int iVar3;
  parameter_type pQVar4;
  arrow_operator_result ppQVar5;
  byte in_SIL;
  QAbstractAnimation *in_RDI;
  undefined3 in_stack_0000001c;
  DeletionPolicy in_stack_ffffffffffffffdc;
  QAbstractAnimation *in_stack_ffffffffffffffe0;
  QAbstractAnimation *this_00;
  undefined7 in_stack_fffffffffffffff0;
  
  bVar1 = in_SIL & 1;
  pQVar4 = QObjectBindableProperty::operator_cast_to_QAbstractAnimation_
                     ((QObjectBindableProperty<QSequentialAnimationGroupPrivate,_QAbstractAnimation_*,_&QSequentialAnimationGroupPrivate::_qt_property_currentAnimation_offset,_nullptr>
                       *)0x689fec);
  if ((pQVar4 != (parameter_type)0x0) &&
     (pVar2 = QObjectBindableProperty::operator_cast_to_State
                        ((QObjectBindableProperty<QAbstractAnimationPrivate,_QAbstractAnimation::State,_&QAbstractAnimationPrivate::_qt_property_state_offset,_nullptr>
                          *)0x68a000), pVar2 != Stopped)) {
    QObjectBindableProperty<QSequentialAnimationGroupPrivate,_QAbstractAnimation_*,_&QSequentialAnimationGroupPrivate::_qt_property_currentAnimation_offset,_nullptr>
    ::operator->((QObjectBindableProperty<QSequentialAnimationGroupPrivate,_QAbstractAnimation_*,_&QSequentialAnimationGroupPrivate::_qt_property_currentAnimation_offset,_nullptr>
                  *)in_stack_ffffffffffffffe0);
    QAbstractAnimation::stop(in_stack_ffffffffffffffe0);
    ppQVar5 = QObjectBindableProperty<QSequentialAnimationGroupPrivate,_QAbstractAnimation_*,_&QSequentialAnimationGroupPrivate::_qt_property_currentAnimation_offset,_nullptr>
              ::operator->((QObjectBindableProperty<QSequentialAnimationGroupPrivate,_QAbstractAnimation_*,_&QSequentialAnimationGroupPrivate::_qt_property_currentAnimation_offset,_nullptr>
                            *)in_stack_ffffffffffffffe0);
    this_00 = *ppQVar5;
    ::QObjectCompatProperty::operator_cast_to_Direction
              ((QObjectCompatProperty<QAbstractAnimationPrivate,_QAbstractAnimation::Direction,_&QAbstractAnimationPrivate::_qt_property_direction_offset,_&QAbstractAnimationPrivate::setDirection,_&QAbstractAnimationPrivate::emitDirectionChanged,_nullptr>
                *)0x68a04a);
    QAbstractAnimation::setDirection((QAbstractAnimation *)this,_in_stack_0000001c);
    QObjectBindableProperty<QSequentialAnimationGroupPrivate,_QAbstractAnimation_*,_&QSequentialAnimationGroupPrivate::_qt_property_currentAnimation_offset,_nullptr>
    ::operator->((QObjectBindableProperty<QSequentialAnimationGroupPrivate,_QAbstractAnimation_*,_&QSequentialAnimationGroupPrivate::_qt_property_currentAnimation_offset,_nullptr>
                  *)this_00);
    iVar3 = QAbstractAnimation::totalDuration(in_RDI);
    if (iVar3 == -1) {
      QObjectBindableProperty::operator_cast_to_QAbstractAnimation_
                ((QObjectBindableProperty<QSequentialAnimationGroupPrivate,_QAbstractAnimation_*,_&QSequentialAnimationGroupPrivate::_qt_property_currentAnimation_offset,_nullptr>
                  *)0x68a085);
      QAnimationGroupPrivate::connectUncontrolledAnimation
                ((QAnimationGroupPrivate *)CONCAT17(bVar1,in_stack_fffffffffffffff0),in_RDI);
    }
    QObjectBindableProperty<QSequentialAnimationGroupPrivate,_QAbstractAnimation_*,_&QSequentialAnimationGroupPrivate::_qt_property_currentAnimation_offset,_nullptr>
    ::operator->((QObjectBindableProperty<QSequentialAnimationGroupPrivate,_QAbstractAnimation_*,_&QSequentialAnimationGroupPrivate::_qt_property_currentAnimation_offset,_nullptr>
                  *)this_00);
    QAbstractAnimation::start(this_00,in_stack_ffffffffffffffdc);
    if (((bVar1 & 1) == 0) &&
       (pVar2 = QObjectBindableProperty::operator_cast_to_State
                          ((QObjectBindableProperty<QAbstractAnimationPrivate,_QAbstractAnimation::State,_&QAbstractAnimationPrivate::_qt_property_state_offset,_nullptr>
                            *)0x68a0c2), pVar2 == Paused)) {
      ppQVar5 = QObjectBindableProperty<QSequentialAnimationGroupPrivate,_QAbstractAnimation_*,_&QSequentialAnimationGroupPrivate::_qt_property_currentAnimation_offset,_nullptr>
                ::operator->((QObjectBindableProperty<QSequentialAnimationGroupPrivate,_QAbstractAnimation_*,_&QSequentialAnimationGroupPrivate::_qt_property_currentAnimation_offset,_nullptr>
                              *)this_00);
      QAbstractAnimation::pause((QAbstractAnimation *)*ppQVar5);
    }
  }
  return;
}

Assistant:

void QSequentialAnimationGroupPrivate::activateCurrentAnimation(bool intermediate)
{
    if (!currentAnimation || state == QSequentialAnimationGroup::Stopped)
        return;

    currentAnimation->stop();

    // we ensure the direction is consistent with the group's direction
    currentAnimation->setDirection(direction);

    // connects to the finish signal of uncontrolled animations
    if (currentAnimation->totalDuration() == -1)
        connectUncontrolledAnimation(currentAnimation);

    currentAnimation->start();
    if (!intermediate && state == QSequentialAnimationGroup::Paused)
        currentAnimation->pause();
}